

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O3

void __thiscall TPZEigenAnalysis::AssembleT<std::complex<double>>(TPZEigenAnalysis *this)

{
  TPZReference *pTVar1;
  TPZCompMesh *pTVar2;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> TVar3;
  TPZEigenSolver<std::complex<double>_> *pTVar4;
  TPZStructMatrix *pTVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  size_t sVar8;
  long lVar9;
  TPZMatrix<std::complex<double>_> *pTVar10;
  TPZReference *pTVar11;
  TPZEigenAnalysis *pTVar12;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *pTVar13;
  anon_class_1_0_00000001 PardisoConfig;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> mat;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> mat_1;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> matA;
  TPZFMatrix<std::complex<double>_> dummyRhs;
  anon_class_1_0_00000001 local_2d1;
  TPZEigenAnalysis *local_2d0;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_2c8 [2];
  TPZReference local_2b8;
  int64_t local_2a8;
  TPZEigenSolver<std::complex<double>_> *local_2a0;
  TPZEigenSolver<std::complex<double>_> *local_298;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_290;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_288;
  TPZAutoPointer<TPZGuiInterface> local_280;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_278;
  TPZAutoPointer<TPZGuiInterface> local_270;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_268;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_260;
  TPZAutoPointer<TPZGuiInterface> local_258;
  TPZAutoPointer<TPZGuiInterface> local_250;
  undefined1 local_248 [128];
  ios_base local_1c8 [32];
  undefined8 local_1a8;
  undefined **local_1a0;
  void *local_198;
  _func_int **local_180;
  long *local_178;
  undefined8 local_160;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_c0.fElem = (complex<double> *)0x0;
  local_c0.fGiven = (complex<double> *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  local_c0.fWork.fStore = (complex<double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if ((this->super_TPZAnalysis).fCompMesh == (TPZCompMesh *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248 + 0x10),
               "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248 + 0x10),"\nNo computational mesh found!\n",0x1e);
    std::__cxx11::stringbuf::str();
    TVar3.fRef = local_2c8[0].fRef;
    if (local_2c8[0].fRef == (TPZReference *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
    }
    else {
      sVar8 = strlen((char *)local_2c8[0].fRef);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)TVar3.fRef,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    if (local_2c8[0].fRef != &local_2b8) {
      operator_delete(local_2c8[0].fRef,
                      (ulong)((long)&((local_2b8.fPointer)->super_TPZBaseMatrix).super_TPZSavable.
                                     _vptr_TPZSavable + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_248);
    std::ios_base::~ios_base(local_1c8);
  }
  else {
    pTVar1 = (this->super_TPZAnalysis).fStructMatrix.fRef;
    if ((pTVar1 == (TPZReference *)0x0) ||
       (pTVar5 = pTVar1->fPointer, pTVar5 == (TPZStructMatrix *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Setting default struct matrix: skyline(non-symmetric)",0x35)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
      TPZSkylineNSymStructMatrix
                ((TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                  *)local_248,(this->super_TPZAnalysis).fCompMesh);
      TPZAnalysis::SetStructuralMatrix(&this->super_TPZAnalysis,(TPZStructMatrix *)local_248);
      local_160 = 0x1969258;
      local_248._0_8_ =
           TPZSkylineStructMatrix<std::complex<double>,TPZStructMatrixOR<std::complex<double>>>-in-TPZSkylineNSymStructMatrix<std::complex<double>,TPZStructMatrixOR<std::complex<double>>>
           ::construction_vtable + 0x68;
      local_1a8 = 0x1969158;
      local_180 = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_178 != (long *)0x0) {
        operator_delete__(local_178);
      }
      local_1a0 = &PTR__TPZVec_01813f30;
      if (local_198 != (void *)0x0) {
        operator_delete__(local_198);
      }
      TPZStructMatrix::~TPZStructMatrix
                ((TPZStructMatrix *)local_248,&PTR_construction_vtable_104__01968fa0);
      pTVar5 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
    }
    *(undefined1 *)((long)&pTVar5->fMesh + *(long *)(*(long *)pTVar5 + -0x60) + 4) = 0;
    EigenSolver<std::complex<double>>(this);
    pTVar5 = ((this->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
    local_2a8 = (&(pTVar5->fEquationFilter).fNumEq)[(ulong)(pTVar5->fEquationFilter).fIsActive * 4];
    local_2d0 = this;
    local_2a0 = EigenSolver<std::complex<double>>(this);
    local_298 = local_2a0;
    if (local_2a0->fIsGeneralised == true) {
      pTVar2 = (local_2d0->super_TPZAnalysis).fCompMesh;
      for (p_Var7 = (pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) ||
           (plVar6 = (long *)__dynamic_cast(p_Var7[1]._M_parent,&TPZMaterial::typeinfo,
                                            &TPZMatGeneralisedEigenVal::typeinfo,0xfffffffffffffffe)
           , plVar6 == (long *)0x0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]",0x40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\nERROR: cannot solve generalised EVP if\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"the materials do not have the interface:\n",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZMatGeneralisedEigenVal\n",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Aborting...\n",0xc);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZEigenAnalysis.cpp"
                     ,0xa5);
        }
        (**(code **)(*plVar6 + 0x48))(plVar6);
      }
    }
    pTVar4 = local_2a0;
    pTVar12 = local_2d0;
    local_248._0_8_ = (local_2a0->fMatrixA).fRef;
    LOCK();
    (((TPZReference *)local_248._0_8_)->fCounter).super___atomic_base<int>._M_i =
         (((TPZReference *)local_248._0_8_)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pTVar13 = &local_298->fMatrixA;
    if ((((TPZReference *)local_248._0_8_ == (TPZReference *)0x0) ||
        (pTVar10 = ((TPZReference *)local_248._0_8_)->fPointer,
        pTVar10 == (TPZMatrix<std::complex<double>_> *)0x0)) ||
       ((pTVar10->super_TPZBaseMatrix).fRow != local_2a8)) {
      local_258.fRef = (local_2d0->super_TPZAnalysis).fGuiInterface.fRef;
      pTVar5 = ((local_2d0->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
      lVar9 = *(long *)(*(long *)pTVar5 + -0x60);
      LOCK();
      ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar9 = (**(code **)(*(long *)((long)&pTVar5->field_0x0 + lVar9) + 0x68))
                        ((long)&pTVar5->field_0x0 + lVar9,&local_c0);
      if (lVar9 == 0) {
        pTVar10 = (TPZMatrix<std::complex<double>_> *)0x0;
      }
      else {
        pTVar10 = (TPZMatrix<std::complex<double>_> *)
                  __dynamic_cast(lVar9,&TPZBaseMatrix::typeinfo,
                                 &TPZMatrix<std::complex<double>>::typeinfo,0);
      }
      local_2c8[0].fRef = (TPZReference *)operator_new(0x10);
      ((local_2c8[0].fRef)->fCounter).super___atomic_base<int>._M_i = 0;
      (local_2c8[0].fRef)->fPointer = pTVar10;
      LOCK();
      ((local_2c8[0].fRef)->fCounter).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_258);
      local_260.fRef = local_2c8[0].fRef;
      LOCK();
      ((local_2c8[0].fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_2c8[0].fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator=(pTVar13,&local_260);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_260);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(local_2c8);
    }
    else {
      (*(pTVar10->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xf])();
      pTVar12 = local_2d0;
      local_250.fRef = (local_2d0->super_TPZAnalysis).fGuiInterface.fRef;
      pTVar5 = ((local_2d0->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
      lVar9 = *(long *)(*(long *)pTVar5 + -0x60);
      pTVar10 = *(TPZMatrix<std::complex<double>_> **)local_248._0_8_;
      LOCK();
      ((local_250.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_250.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      (**(code **)(*(long *)((long)&pTVar5->field_0x0 + lVar9) + 0x48))
                ((long)&pTVar5->field_0x0 + lVar9,pTVar10,&local_c0);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_250);
    }
    local_268.fRef = pTVar13->fRef;
    LOCK();
    ((local_268.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_268.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    AssembleT<std::complex<double>_>::anon_class_1_0_00000001::operator()(&local_2d1,&local_268);
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_268);
    if (pTVar4->fIsGeneralised == true) {
      pTVar2 = (pTVar12->super_TPZAnalysis).fCompMesh;
      for (p_Var7 = (pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(pTVar2->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) ||
           (plVar6 = (long *)__dynamic_cast(p_Var7[1]._M_parent,&TPZMaterial::typeinfo,
                                            &TPZMatGeneralisedEigenVal::typeinfo,0xfffffffffffffffe)
           , plVar6 == (long *)0x0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]",0x40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\nERROR: cannot solve generalised EVP if\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"the materials do not have the interface:\n",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZMatGeneralisedEigenVal\n",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Aborting...\n",0xc);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZEigenAnalysis.cpp"
                     ,0xc2);
        }
        (**(code **)(*plVar6 + 0x50))(plVar6);
      }
      local_2c8[0].fRef = (local_2a0->fMatrixB).fRef;
      LOCK();
      ((local_2c8[0].fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_2c8[0].fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pTVar13 = &local_298->fMatrixB;
      if (((local_2c8[0].fRef == (TPZReference *)0x0) ||
          (pTVar10 = (local_2c8[0].fRef)->fPointer,
          pTVar10 == (TPZMatrix<std::complex<double>_> *)0x0)) ||
         ((pTVar10->super_TPZBaseMatrix).fRow != local_2a8)) {
        local_280.fRef = (local_2d0->super_TPZAnalysis).fGuiInterface.fRef;
        pTVar5 = ((local_2d0->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
        lVar9 = *(long *)(*(long *)pTVar5 + -0x60);
        LOCK();
        ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar9 = (**(code **)(*(long *)((long)&pTVar5->field_0x0 + lVar9) + 0x68))
                          ((long)&pTVar5->field_0x0 + lVar9,&local_c0);
        if (lVar9 == 0) {
          pTVar10 = (TPZMatrix<std::complex<double>_> *)0x0;
        }
        else {
          pTVar10 = (TPZMatrix<std::complex<double>_> *)
                    __dynamic_cast(lVar9,&TPZBaseMatrix::typeinfo,
                                   &TPZMatrix<std::complex<double>>::typeinfo,0);
        }
        pTVar11 = (TPZReference *)operator_new(0x10);
        (pTVar11->fCounter).super___atomic_base<int>._M_i = 0;
        pTVar11->fPointer = pTVar10;
        LOCK();
        (pTVar11->fCounter).super___atomic_base<int>._M_i = 1;
        UNLOCK();
        local_278.fRef = pTVar11;
        TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_280);
        LOCK();
        (pTVar11->fCounter).super___atomic_base<int>._M_i =
             (pTVar11->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_288.fRef = pTVar11;
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator=(pTVar13,&local_288);
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_288);
        TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_278);
      }
      else {
        (*(pTVar10->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xf])();
        local_270.fRef = (local_2d0->super_TPZAnalysis).fGuiInterface.fRef;
        pTVar5 = ((local_2d0->super_TPZAnalysis).fStructMatrix.fRef)->fPointer;
        lVar9 = *(long *)(*(long *)pTVar5 + -0x60);
        pTVar10 = (local_2c8[0].fRef)->fPointer;
        LOCK();
        ((local_270.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_270.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        (**(code **)(*(long *)((long)&pTVar5->field_0x0 + lVar9) + 0x48))
                  ((long)&pTVar5->field_0x0 + lVar9,pTVar10,&local_c0);
        TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_270);
      }
      local_290.fRef = pTVar13->fRef;
      LOCK();
      ((local_290.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_290.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      AssembleT<std::complex<double>_>::anon_class_1_0_00000001::operator()(&local_2d1,&local_290);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_290);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(local_2c8);
    }
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)local_248);
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZEigenAnalysis::AssembleT()
{
  //this lambda will be used to prevent pardiso for disturbing pivots
  auto PardisoConfig = [](TPZAutoPointer<TPZMatrix<TVar>> mat){
    auto ssp = TPZAutoPointerDynamicCast<TPZSYsmpMatrix<TVar>>(mat);
    auto sp = TPZAutoPointerDynamicCast<TPZFYsmpMatrix<TVar>>(mat);
    TPZPardisoSolver<TVar> *pardiso{nullptr};
    if(ssp){
      pardiso = &(ssp->GetPardisoControl());
    }else if(sp){
      pardiso = &(sp->GetPardisoControl());
    }
    if(pardiso){
      auto param = pardiso->GetParam();
      //do not perturb pivot elements
      param[0] = 0;
    }
  };
  
  //it wont be resized or anything.
  TPZFMatrix<TVar> dummyRhs;
  if (!fCompMesh) {
    std::stringstream sout;
    sout << __PRETTY_FUNCTION__;
    sout << "\nNo computational mesh found!\n";
#ifdef PZ_LOG
    LOGPZ_ERROR(logger, sout.str().c_str());
#else
    std::cout << sout.str().c_str() << std::endl;
#endif
    return;
  }
  if (!this->fStructMatrix) {
#ifdef USING_MKL
    std::cout << "Setting default struct matrix: sparse(non-symmetric)"
              << std::endl;
    TPZSpStructMatrix<TVar> defaultMatrix(fCompMesh);
#else
    std::cout << "Setting default struct matrix: skyline(non-symmetric)"
              << std::endl;
    TPZSkylineNSymStructMatrix<TVar> defaultMatrix(fCompMesh);
#endif
    this->SetStructuralMatrix(defaultMatrix);
  }
  
  fStructMatrix->SetComputeRhs(false);
  
  {
    auto *eigSolver = &(this->EigenSolver<TVar>()); 
    if (!eigSolver) {
      std::cout << "Setting default solver: Krylov" << std::endl;
      constexpr int nev{10};
      constexpr int dimKrylov{100};
      TPZKrylovEigenSolver<TVar> defaultSolver;
      defaultSolver.SetNEigenpairs(nev);
      defaultSolver.SetKrylovDim(dimKrylov);
      std::cout << "Setting nev: " << nev << std::endl;
      std::cout << "Setting krylov dim: " << dimKrylov << std::endl;
      this->SetSolver(defaultSolver);
    }
  }
  
  const auto sz = fStructMatrix->EquationFilter().NActiveEquations();
  auto &eigSolver = this->EigenSolver<TVar>();
  if (eigSolver.IsGeneralised()) {
    
    
    auto &materialVec = fCompMesh->MaterialVec();
    for (auto &&item : materialVec) {
      auto mat = (item.second);
      auto eigmat = dynamic_cast<TPZMatGeneralisedEigenVal *>(mat);
      if (eigmat)
        eigmat->SetMatrixA();
      else {
        PZError << __PRETTY_FUNCTION__;
        PZError << "\nERROR: cannot solve generalised EVP if\n"
                << "the materials do not have the interface:\n"
                << "TPZMatGeneralisedEigenVal\n"
                << "Aborting...\n";
        DebugStop();
      }
    }
  }
  auto matA = eigSolver.MatrixA();
  if (matA && matA->Rows() == sz) {
    matA->Zero();
    fStructMatrix->Assemble(*matA, dummyRhs, fGuiInterface);
  } else {
    TPZAutoPointer<TPZMatrix<TVar>> mat =
      dynamic_cast<TPZMatrix<TVar>*>(
          fStructMatrix->CreateAssemble(dummyRhs, fGuiInterface));
    eigSolver.SetMatrixA(mat);
  }
  PardisoConfig(eigSolver.MatrixA());
  // fSolver->UpdateFrom(fSolver->MatrixA());
  if (eigSolver.IsGeneralised()) {
    auto &materialVec = fCompMesh->MaterialVec();
    for (auto &&item : materialVec) {
      auto mat = (item.second);
      auto eigmat = dynamic_cast<TPZMatGeneralisedEigenVal *>(mat);
      if (eigmat)
        eigmat->SetMatrixB();
      else {
        PZError << __PRETTY_FUNCTION__;
        PZError << "\nERROR: cannot solve generalised EVP if\n"
                << "the materials do not have the interface:\n"
                << "TPZMatGeneralisedEigenVal\n"
                << "Aborting...\n";
        DebugStop();
      }
    }
    auto matB = eigSolver.MatrixB();
    if (matB && matB->Rows() == sz) {
      matB->Zero();
      fStructMatrix->Assemble(*matB, dummyRhs, fGuiInterface);
    } else {
      TPZAutoPointer<TPZMatrix<TVar>> mat =
        dynamic_cast<TPZMatrix<TVar>*>(
          fStructMatrix->CreateAssemble(dummyRhs, fGuiInterface));
      eigSolver.SetMatrixB(mat);
    }
    PardisoConfig(eigSolver.MatrixB());
  }
}